

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O2

void mon_catchup_elapsed_time(monst *mtmp,long nmv)

{
  byte bVar1;
  long lVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  char cVar6;
  uint uVar7;
  uchar uVar8;
  int iVar9;
  char cVar10;
  ulong uVar12;
  int iVar11;
  
  uVar12 = 0x7ffe;
  if (nmv < 0x7ffe) {
    uVar12 = nmv;
  }
  bVar1 = mtmp->mblinded;
  cVar10 = (char)uVar12;
  iVar11 = (int)uVar12;
  if (bVar1 != 0) {
    uVar8 = bVar1 - cVar10;
    if ((int)(uint)bVar1 <= iVar11) {
      uVar8 = '\x01';
    }
    mtmp->mblinded = uVar8;
  }
  bVar1 = mtmp->mfrozen;
  if (bVar1 != 0) {
    uVar8 = bVar1 - cVar10;
    if ((int)(uint)bVar1 <= iVar11) {
      uVar8 = '\x01';
    }
    mtmp->mfrozen = uVar8;
  }
  bVar1 = mtmp->mfleetim;
  if (bVar1 != 0) {
    uVar8 = '\x01';
    if (iVar11 < (int)(uint)bVar1) {
      uVar8 = bVar1 - cVar10;
    }
    mtmp->mfleetim = uVar8;
  }
  uVar7 = *(uint *)&mtmp->field_0x60;
  if ((uVar7 >> 0x17 & 1) != 0) {
    uVar4 = rn2(iVar11 + 1);
    uVar7 = *(uint *)&mtmp->field_0x60;
    if (0x14 < uVar4) {
      uVar7 = uVar7 & 0xff7fffff;
      *(uint *)&mtmp->field_0x60 = uVar7;
    }
  }
  if ((uVar7 >> 0x15 & 1) != 0) {
    uVar4 = rn2(iVar11 + 1);
    uVar7 = *(uint *)&mtmp->field_0x60;
    if (0x19 < uVar4) {
      uVar7 = uVar7 & 0xffdfffff;
      *(uint *)&mtmp->field_0x60 = uVar7;
    }
  }
  if (((uVar7 >> 0x14 & 1) != 0) && (uVar7 = rn2(iVar11 + 1), 5 < uVar7)) {
    mtmp->field_0x62 = mtmp->field_0x62 & 0xef;
  }
  iVar5 = mtmp->meating - iVar11;
  if (mtmp->meating < iVar11) {
    iVar5 = 0;
  }
  iVar9 = mtmp->mspec_used - iVar11;
  if (mtmp->mspec_used < iVar11) {
    iVar9 = 0;
  }
  mtmp->meating = iVar5;
  mtmp->mspec_used = iVar9;
  cVar10 = mtmp->mtame;
  if (cVar10 != '\0') {
    lVar2 = (long)(iVar11 + 0x4b) / 0x96;
    cVar3 = (char)lVar2;
    iVar5 = (int)lVar2;
    if (iVar5 < cVar10) {
      cVar6 = cVar10 - cVar3;
      mtmp->mtame = cVar6;
      if (cVar6 != '\0') {
        if (((*(uint *)&mtmp->field_0x60 >> 0x1a & 1) == 0) &&
           ((mtmp->data->mflags1 & 0x60000000) != 0)) {
          iVar5 = *(int *)((long)&mtmp[1].data + 4);
          uVar7 = iVar5 + 0x2ee;
          if (iVar5 + 500U < moves) {
            if ((uVar7 < moves) || (mtmp->mhp < 3)) {
LAB_00170045:
              uVar7 = *(uint *)&mtmp->field_0x60 & 0xfbbfffff;
              goto LAB_0016fff3;
            }
          }
          else if (uVar7 < moves) goto LAB_00170045;
        }
        if (cVar10 != cVar3) goto LAB_00170018;
      }
    }
    else {
      iVar5 = rn2(iVar5);
      if (cVar10 <= iVar5) {
        uVar7 = *(uint *)&mtmp->field_0x60 & 0xffbfffff;
LAB_0016fff3:
        *(uint *)&mtmp->field_0x60 = uVar7;
      }
      mtmp->mtame = '\0';
    }
  }
  if ((mtmp->field_0x63 & 1) != 0) {
    impossible("catching up for leashed monster?");
    m_unleash(mtmp,'\0');
  }
LAB_00170018:
  iVar5 = (int)((long)((ulong)(uint)(iVar11 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) / 0x14);
  if ((mtmp->data->mflags1 >> 0x17 & 1) != 0) {
    iVar5 = iVar11;
  }
  iVar5 = iVar5 + mtmp->mhp;
  if (mtmp->mhpmax <= iVar5) {
    iVar5 = mtmp->mhpmax;
  }
  mtmp->mhp = iVar5;
  return;
}

Assistant:

void mon_catchup_elapsed_time(struct monst *mtmp, long nmv)
{
	int imv = 0;	/* avoid zillions of casts and lint warnings */

	if (nmv >= LARGEST_INT)		/* paranoia */
	    imv = LARGEST_INT - 1;
	else
	    imv = (int)nmv;

	/* might stop being afraid, blind or frozen */
	/* set to 1 and allow final decrement in movemon() */
	if (mtmp->mblinded) {
	    if (imv >= (int) mtmp->mblinded) mtmp->mblinded = 1;
	    else mtmp->mblinded -= imv;
	}
	if (mtmp->mfrozen) {
	    if (imv >= (int) mtmp->mfrozen) mtmp->mfrozen = 1;
	    else mtmp->mfrozen -= imv;
	}
	if (mtmp->mfleetim) {
	    if (imv >= (int) mtmp->mfleetim) mtmp->mfleetim = 1;
	    else mtmp->mfleetim -= imv;
	}

	/* might recover from temporary trouble */
	if (mtmp->mtrapped && rn2(imv + 1) > 40/2) mtmp->mtrapped = 0;
	if (mtmp->mconf    && rn2(imv + 1) > 50/2) mtmp->mconf = 0;
	if (mtmp->mstun    && rn2(imv + 1) > 10/2) mtmp->mstun = 0;

	/* might finish eating or be able to use special ability again */
	if (imv > mtmp->meating) mtmp->meating = 0;
	else mtmp->meating -= imv;
	if (imv > mtmp->mspec_used) mtmp->mspec_used = 0;
	else mtmp->mspec_used -= imv;

	/* reduce tameness for every 150 moves you are separated */
	if (mtmp->mtame) {
	    int wilder = (imv + 75) / 150;
	    if (mtmp->mtame > wilder) mtmp->mtame -= wilder;	/* less tame */
	    else if (mtmp->mtame > rn2(wilder)) mtmp->mtame = 0;  /* untame */
	    else mtmp->mtame = mtmp->mpeaceful = 0;		/* hostile! */
	}
	/* check to see if it would have died as a pet; if so, go wild instead
	 * of dying the next time we call dog_move()
	 */
	if (mtmp->mtame && !mtmp->isminion &&
			(carnivorous(mtmp->data) || herbivorous(mtmp->data))) {
	    struct edog *edog = EDOG(mtmp);

	    if ((moves > edog->hungrytime + 500 && mtmp->mhp < 3) ||
		    (moves > edog->hungrytime + 750))
		mtmp->mtame = mtmp->mpeaceful = 0;
	}

	if (!mtmp->mtame && mtmp->mleashed) {
	    /* leashed monsters should always be with hero, consequently
	       never losing any time to be accounted for later */
	    impossible("catching up for leashed monster?");
	    m_unleash(mtmp, FALSE);
	}

	/* recover lost hit points */
	if (!regenerates(mtmp->data)) imv /= 20;
	if (mtmp->mhp + imv >= mtmp->mhpmax)
	    mtmp->mhp = mtmp->mhpmax;
	else mtmp->mhp += imv;
}